

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::Path::parent(Path *__return_storage_ptr__,Path *this)

{
  undefined8 *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *pcVar4;
  size_t sVar5;
  String *pSVar6;
  String *iter;
  String *pSVar7;
  long lVar8;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  Array<kj::String> result;
  
  sVar2 = (this->parts).size_;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = sVar2 != 0;
  _kjCondition.left = sVar2;
  if (_kjCondition.result) {
    pSVar7 = (this->parts).ptr;
    pSVar6 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar2 - 1);
    _kjCondition.op.content.size_ = (size_t)&kj::_::HeapArrayDisposer::instance;
    for (lVar8 = 0; sVar2 * 0x18 + -0x18 != lVar8; lVar8 = lVar8 + 0x18) {
      puVar1 = (undefined8 *)((long)&(pSVar6->content).ptr + lVar8);
      pcVar4 = (pSVar7->content).ptr;
      sVar5 = (pSVar7->content).size_;
      pAVar3 = (pSVar7->content).disposer;
      (pSVar7->content).ptr = (char *)0x0;
      (pSVar7->content).size_ = 0;
      *puVar1 = pcVar4;
      puVar1[1] = sVar5;
      puVar1[2] = pAVar3;
      f.exception = (Exception *)0x0;
      _kjCondition._8_8_ = puVar1 + 3;
      Array<char>::~Array((Array<char> *)&f);
      pSVar7 = pSVar7 + 1;
    }
    result.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    _kjCondition.left = 0;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = (char *)0x0;
    ArrayBuilder<kj::String>::dispose((ArrayBuilder<kj::String> *)&_kjCondition);
    (__return_storage_ptr__->parts).ptr = pSVar6;
    (__return_storage_ptr__->parts).size_ = lVar8 / 0x18;
    (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    result.ptr = (String *)0x0;
    result.size_ = 0;
    Array<kj::String>::~Array(&result);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[24]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x83,FAILED,"parts.size() > 0","_kjCondition,\"root path has no parent\"",
             &_kjCondition,(char (*) [24])"root path has no parent");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

bool PathPtr::operator==(PathPtr other) const {
  return parts == other.parts;
}